

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btBvhTriangleMeshShape * __thiscall
btCollisionWorldImporter::createBvhTriangleMeshShape
          (btCollisionWorldImporter *this,btStridingMeshInterface *trimesh,btOptimizedBvh *bvh)

{
  btBvhTriangleMeshShape *meshInterface;
  btBvhTriangleMeshShape *pbVar1;
  btQuantizedBvh *in_RDX;
  btBvhTriangleMeshShape *in_RSI;
  btBvhTriangleMeshShape *ts;
  btBvhTriangleMeshShape *bvhTriMesh;
  btCollisionShape **in_stack_ffffffffffffff68;
  btAlignedObjectArray<btCollisionShape_*> *in_stack_ffffffffffffff70;
  undefined2 uVar2;
  btStridingMeshInterface *in_stack_ffffffffffffff78;
  btBvhTriangleMeshShape *in_stack_ffffffffffffff80;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btVector3 local_44;
  btBvhTriangleMeshShape *local_28;
  btQuantizedBvh *local_20;
  btBvhTriangleMeshShape *local_18;
  btBvhTriangleMeshShape *local_8;
  
  if (in_RDX == (btQuantizedBvh *)0x0) {
    pbVar1 = (btBvhTriangleMeshShape *)btBvhTriangleMeshShape::operator_new(0x187ed1);
    btBvhTriangleMeshShape::btBvhTriangleMeshShape
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
               SUB81((ulong)in_stack_ffffffffffffff70 >> 0x30,0));
    btAlignedObjectArray<btCollisionShape_*>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_8 = pbVar1;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    meshInterface = (btBvhTriangleMeshShape *)btBvhTriangleMeshShape::operator_new(0x187db5);
    uVar2 = (undefined2)((ulong)in_stack_ffffffffffffff70 >> 0x30);
    btQuantizedBvh::isQuantized(local_20);
    btBvhTriangleMeshShape::btBvhTriangleMeshShape
              (local_18,(btStridingMeshInterface *)meshInterface,SUB21((ushort)uVar2 >> 8,0),
               SUB21(uVar2,0));
    local_48 = 1.0;
    local_4c = 1.0;
    local_50 = 1.0;
    pbVar1 = meshInterface;
    local_28 = meshInterface;
    btVector3::btVector3(&local_44,&local_48,&local_4c,&local_50);
    btBvhTriangleMeshShape::setOptimizedBvh(local_18,(btOptimizedBvh *)pbVar1,(btVector3 *)local_20)
    ;
    btAlignedObjectArray<btCollisionShape_*>::push_back
              ((btAlignedObjectArray<btCollisionShape_*> *)local_20,
               (btCollisionShape **)meshInterface);
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

btBvhTriangleMeshShape* btCollisionWorldImporter::createBvhTriangleMeshShape(btStridingMeshInterface* trimesh, btOptimizedBvh* bvh)
{
	if (bvh)
	{
		btBvhTriangleMeshShape* bvhTriMesh = new btBvhTriangleMeshShape(trimesh,bvh->isQuantized(), false);
		bvhTriMesh->setOptimizedBvh(bvh);
		m_allocatedCollisionShapes.push_back(bvhTriMesh);
		return bvhTriMesh;
	}

	btBvhTriangleMeshShape* ts = new btBvhTriangleMeshShape(trimesh,true);
	m_allocatedCollisionShapes.push_back(ts);
	return ts;

}